

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint huffmanDecodeSymbol(LodePNGBitReader *reader,HuffmanTree *codetree)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  long in_RSI;
  LodePNGBitReader *in_RDI;
  uint index2;
  unsigned_short value;
  unsigned_short l;
  unsigned_short code;
  undefined4 local_4;
  
  uVar3 = peekBits(in_RDI,9);
  uVar2 = (ushort)*(byte *)(*(long *)(in_RSI + 0x18) + (ulong)(ushort)uVar3);
  uVar1 = *(ushort *)(*(long *)(in_RSI + 0x20) + (ulong)(ushort)uVar3 * 2);
  if (uVar2 < 10) {
    advanceBits(in_RDI,(ulong)uVar2);
  }
  else {
    advanceBits(in_RDI,9);
    uVar3 = peekBits(in_RDI,(ulong)(uVar2 - 9));
    advanceBits(in_RDI,(ulong)(*(byte *)(*(long *)(in_RSI + 0x18) + (ulong)(uVar1 + uVar3)) - 9));
    uVar1 = *(ushort *)(*(long *)(in_RSI + 0x20) + (ulong)(uVar1 + uVar3) * 2);
  }
  local_4 = (uint)uVar1;
  return local_4;
}

Assistant:

static unsigned huffmanDecodeSymbol(LodePNGBitReader* reader, const HuffmanTree* codetree) {
  unsigned short code = peekBits(reader, FIRSTBITS);
  unsigned short l = codetree->table_len[code];
  unsigned short value = codetree->table_value[code];
  if (l <= FIRSTBITS) {
    advanceBits(reader, l);
    return value;
  }
  else {
    unsigned index2;
    advanceBits(reader, FIRSTBITS);
    index2 = value + peekBits(reader, l - FIRSTBITS);
    advanceBits(reader, codetree->table_len[index2] - FIRSTBITS);
    return codetree->table_value[index2];
  }
}